

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pragma_all_once(CTcTokenizer *this)

{
  tc_toktyp_t tVar1;
  byte *in_RDI;
  tc_toktyp_t tok;
  undefined4 in_stack_fffffffffffffff0;
  
  tVar1 = next_on_line((CTcTokenizer *)0x29a757);
  if ((tVar1 == TOKT_PLUS) || (tVar1 == TOKT_EOF)) {
    *in_RDI = *in_RDI & 0xfe | 1;
  }
  else if (tVar1 == TOKT_MINUS) {
    *in_RDI = *in_RDI & 0xfe;
  }
  else {
    log_warning(0x271f);
  }
  clear_linebuf((CTcTokenizer *)CONCAT44(tVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void CTcTokenizer::pragma_all_once()
{
    tc_toktyp_t tok;

    /* get the next token */
    tok = next_on_line();

    /* 
     *   "+" or empty (end of line or whitespace) indicates ALL_ONCE mode;
     *   '-' indicates standard mode 
     */
    if (tok == TOKT_PLUS || tok == TOKT_EOF)
        all_once_ = TRUE;
    else if (tok == TOKT_MINUS)
        all_once_ = FALSE;
    else
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);

    /* don't retain this pragma in the result */
    clear_linebuf();
}